

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

int trsrch(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double *dx,double maxstep
          ,int iter,double *L,double *hess,double stol,double *ioval,double eps,double *x)

{
  size_t __size;
  uint N_00;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_a0;
  double funcprev;
  double local_90;
  double *local_88;
  custom_function *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double local_58;
  double local_50;
  ulong local_48;
  double *local_40;
  uint local_34;
  
  ioval[7] = 1.0;
  uVar9 = (ulong)N;
  __size = uVar9 * 8;
  funcprev = eps;
  local_90 = stol;
  local_88 = xi;
  local_80 = funcpt;
  local_50 = maxstep;
  local_34 = N;
  local_40 = (double *)malloc(__size);
  local_70 = (double *)malloc(__size);
  local_68 = (double *)malloc(__size);
  local_a0 = 0.0;
  uVar2 = 0;
  uVar10 = 0;
  if (0 < N) {
    uVar10 = (ulong)local_34;
  }
  local_58 = 0.0;
  for (; uVar10 != uVar2; uVar2 = uVar2 + 1) {
    local_58 = local_58 + dx[uVar2] * sN[uVar2] * dx[uVar2] * sN[uVar2];
  }
  local_60 = dx;
  local_48 = uVar9;
  if (local_58 < 0.0) {
    local_58 = sqrt(local_58);
  }
  else {
    local_58 = SQRT(local_58);
  }
  pdVar6 = local_60;
  if ((iter == 1) || ((*ioval == -1.0 && (!NAN(*ioval))))) {
    ioval[1] = 0.0;
    for (uVar2 = 0; uVar10 != uVar2; uVar2 = uVar2 + 1) {
      local_40[uVar2] = jac[uVar2] / local_60[uVar2];
    }
    dVar11 = l2norm(local_40,(int)local_48);
    uVar2 = local_48 & 0xffffffff;
    dVar12 = 0.0;
    pdVar4 = L;
    pdVar5 = jac;
    for (uVar3 = 0; uVar3 != uVar10; uVar3 = uVar3 + 1) {
      dVar13 = 0.0;
      pdVar7 = pdVar4;
      for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        dVar13 = dVar13 + (*pdVar7 * pdVar5[uVar8]) / (pdVar6[uVar8] * pdVar6[uVar8]);
        pdVar7 = pdVar7 + uVar9;
      }
      dVar12 = dVar12 + dVar13 * dVar13;
      uVar2 = uVar2 - 1;
      pdVar6 = pdVar6 + 1;
      pdVar5 = pdVar5 + 1;
      pdVar4 = pdVar4 + local_48 + 1;
    }
    dVar12 = (SQRT(dVar11 * dVar11) * dVar11 * dVar11) / dVar12;
    *ioval = dVar12;
    if (local_50 < dVar12) {
      *ioval = local_50;
    }
  }
  N_00 = local_34;
  pdVar6 = local_60;
  uVar2 = 4;
  local_78 = sN;
  while ((pdVar4 = local_70, uVar1 = (uint)uVar2, 0xf < uVar1 ||
         ((0x8003U >> (uVar1 & 0x1f) & 1) == 0))) {
    local_48 = uVar2;
    trstep(jac,sN,N_00,pdVar6,L,hess,local_58,ioval,funcprev,local_70);
    sN = local_78;
    ioval[2] = *ioval;
    uVar1 = trupdate(local_80,local_88,jac,pdVar4,N_00,pdVar6,local_50,(int)local_48,L,hess,local_90
                     ,0,ioval,local_68,&local_a0,x);
    uVar2 = (ulong)uVar1;
  }
  free(local_40);
  free(local_70);
  free(local_68);
  return uVar1;
}

Assistant:

int trsrch(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double * dx,double maxstep,
		int iter,double *L,double *hess,double stol,double *ioval,double eps,double *x) {
	int retval,i,j,method;		
	double alpha,beta;
	double nlen,t1,funcprev;
	double *temp,*step,*xprev;
	/*
	 * ioval[0] = delta; [trust region current radius]
	 * ioval[1] = lambda;
	 * ioval[2] = deltaprev; [trust region previous radius]
	 * ioval[3] = phi;
	 * ioval[4] = phi';
	 * ioval[5] = phi_init';
	 * ioval[5] and ioval[6] are "binary" flags.
	 */ 
	retval = 4;
	nlen = 0.0;
	ioval[7] = 1.0;
	method = 0;
	temp = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	xprev = (double*) malloc(sizeof(double) *N);

	funcprev = 0.0;
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * sN[i] * dx[i] * sN[i];
	}
	nlen = sqrt(nlen);
	if (iter == 1 || ioval[0] == -1) {
		ioval[1] = 0.;
		for (i = 0; i < N;++i) {
			temp[i] = jac[i] / dx[i];
		}
		alpha = l2norm(temp,N);
		alpha = alpha*alpha;
		
		beta = 0;
		for(i = 0; i < N;++i) {
			t1 = 0.;
			for(j = i; j < N;++j) {
				t1+= L[j*N+i]*jac[j]/(dx[j] * dx[j]);
			}
			beta += t1*t1;
		}
		ioval[0] = alpha * sqrt(alpha) / beta;
		
		if (ioval[0] > maxstep) {
			ioval[0] = maxstep;
		}
	}
	
	while (retval >= 2 && retval != 15) {
		trstep(jac,sN,N,dx,L,hess,nlen,ioval,eps,step);
		ioval[2] = ioval[0];
		retval = trupdate(funcpt,xi,jac,step,N,dx,maxstep,retval,L,hess,stol,method,ioval,xprev,&funcprev,x);
	}
	 
	free(temp); 
	free(step);
	free(xprev);
	return retval;

}